

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifest.cpp
# Opt level: O1

void __thiscall llbuild::ninja::Manifest::Manifest(Manifest *this)

{
  SmallVectorImpl<void_*> *pSVar1;
  SmallVectorImpl<std::pair<void_*,_unsigned_long>_> *pSVar2;
  Pool *pPVar3;
  Rule *pRVar4;
  StringRef Key;
  StringRef Key_00;
  pair<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_bool> pVar5;
  pair<llvm::StringMapIterator<llbuild::ninja::Rule_*>,_bool> pVar6;
  
  (this->allocator).CurPtr = (char *)0x0;
  (this->allocator).End = (char *)0x0;
  (this->allocator).Slabs.super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
  super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX =
       &(this->allocator).Slabs.super_SmallVectorStorage<void_*,_4U>;
  pSVar1 = &(this->allocator).Slabs.super_SmallVectorImpl<void_*>;
  (pSVar1->super_SmallVectorTemplateBase<void_*,_true>).
  super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size = 0;
  (pSVar1->super_SmallVectorTemplateBase<void_*,_true>).
  super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Capacity = 4;
  (this->allocator).CustomSizedSlabs.super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
  super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
  super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.
  BeginX = &(this->allocator).BytesAllocated;
  pSVar2 = &(this->allocator).CustomSizedSlabs.
            super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>;
  (pSVar2->super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>).
  super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.Size
       = 0;
  (pSVar2->super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>).
  super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.
  Capacity = 0;
  (this->allocator).BytesAllocated = 0;
  (this->allocator).RedZoneSize = 1;
  (this->rootScope).parent = (Scope *)0x0;
  (this->rootScope).entries.super_StringMapImpl.TheTable = (StringMapEntryBase **)0x0;
  *(undefined8 *)((long)&(this->rootScope).entries.super_StringMapImpl.TheTable + 4) = 0;
  (this->rootScope).entries.super_StringMapImpl.NumItems = 0;
  (this->rootScope).entries.super_StringMapImpl.NumTombstones = 0;
  (this->rootScope).entries.super_StringMapImpl.ItemSize = 0x28;
  (this->rootScope).rules.super_StringMapImpl.TheTable = (StringMapEntryBase **)0x0;
  (this->rootScope).rules.super_StringMapImpl.NumBuckets = 0;
  (this->rootScope).rules.super_StringMapImpl.NumItems = 0;
  (this->rootScope).rules.super_StringMapImpl.NumTombstones = 0;
  (this->rootScope).rules.super_StringMapImpl.ItemSize = 0x10;
  (this->nodes).super_StringMapImpl.TheTable = (StringMapEntryBase **)0x0;
  (this->nodes).super_StringMapImpl.NumBuckets = 0;
  (this->nodes).super_StringMapImpl.NumItems = 0;
  (this->nodes).super_StringMapImpl.NumTombstones = 0;
  (this->nodes).super_StringMapImpl.ItemSize = 0x10;
  (this->commands).
  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->commands).
  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->commands).
  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pools).super_StringMapImpl.TheTable = (StringMapEntryBase **)0x0;
  *(undefined8 *)((long)&(this->pools).super_StringMapImpl.TheTable + 4) = 0;
  (this->pools).super_StringMapImpl.NumItems = 0;
  (this->pools).super_StringMapImpl.NumTombstones = 0;
  (this->pools).super_StringMapImpl.ItemSize = 0x10;
  (this->defaultTargets).
  super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->defaultTargets).
  super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->defaultTargets).
  super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar3 = (Pool *)llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                             (&this->allocator,0x28,0x10);
  (pPVar3->name)._M_dataplus._M_p = (pointer)&(pPVar3->name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pPVar3,"console","");
  pPVar3->depth = 0;
  this->consolePool = pPVar3;
  pPVar3->depth = 1;
  Key.Length = 7;
  Key.Data = "console";
  pVar5 = llvm::StringMap<llbuild::ninja::Pool_*,_llvm::MallocAllocator>::try_emplace<>
                    (&this->pools,Key);
  *(Pool **)(*(long *)pVar5.first.
                      super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                      .Ptr.
                      super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
            + 8) = pPVar3;
  pRVar4 = (Rule *)llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                             (&this->allocator,0x40,0x10);
  (pRVar4->name)._M_dataplus._M_p = (pointer)&(pRVar4->name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pRVar4,"phony","");
  (pRVar4->parameters).super_StringMapImpl.TheTable = (StringMapEntryBase **)0x0;
  (pRVar4->parameters).super_StringMapImpl.NumBuckets = 0;
  (pRVar4->parameters).super_StringMapImpl.NumItems = 0;
  (pRVar4->parameters).super_StringMapImpl.NumTombstones = 0;
  (pRVar4->parameters).super_StringMapImpl.ItemSize = 0x28;
  this->phonyRule = pRVar4;
  Key_00.Length = 5;
  Key_00.Data = "phony";
  pVar6 = llvm::StringMap<llbuild::ninja::Rule_*,_llvm::MallocAllocator>::try_emplace<>
                    (&(this->rootScope).rules,Key_00);
  *(Rule **)(*(long *)pVar6.first.
                      super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Rule_*>,_llvm::StringMapEntry<llbuild::ninja::Rule_*>_>
                      .Ptr.
                      super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Rule_*>,_llvm::StringMapEntry<llbuild::ninja::Rule_*>_>
            + 8) = pRVar4;
  return;
}

Assistant:

Manifest::Manifest() {
  // Create the built-in console pool, and add it to the pool map.
  consolePool = new (getAllocator()) Pool("console");
  assert(consolePool != nullptr);
  if (consolePool)
    consolePool->setDepth(1);
  pools["console"] = consolePool;

  // Create the built-in phony rule, and add it to the rule map.
  phonyRule = new (getAllocator()) Rule("phony");
  getRootScope().getRules()["phony"] = phonyRule;
}